

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

bool __thiscall
wasm::String::anon_unknown_0::doConvertWTF16ToWTF8
          (anon_unknown_0 *this,ostream *os,string_view str,bool allowWTF)

{
  bool bVar1;
  _Optional_payload_base<unsigned_int> _Var2;
  bool bVar3;
  undefined1 local_38 [8];
  string_view str_local;
  
  str_local._M_len = str._M_len;
  if (os == (ostream *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = true;
    local_38 = (undefined1  [8])os;
    do {
      _Var2 = (_Optional_payload_base<unsigned_int>)
              takeWTF16CodePoint((string_view *)local_38,str._M_str._0_1_);
      bVar1 = _Var2._M_engaged;
      if (((ulong)_Var2 & 0x100000000) == 0) {
        _Var2._M_payload = (_Storage<unsigned_int,_true>)0xfffd;
        _Var2._M_engaged = false;
        _Var2._5_3_ = 0;
      }
      bVar3 = (bool)(bVar3 & bVar1 & 1U);
      writeWTF8CodePoint((ostream *)this,_Var2._M_payload._M_value);
    } while (local_38 != (undefined1  [8])0x0);
  }
  return bVar3;
}

Assistant:

bool doConvertWTF16ToWTF8(std::ostream& os,
                          std::string_view str,
                          bool allowWTF) {
  bool valid = true;

  while (str.size()) {
    auto u = takeWTF16CodePoint(str, allowWTF);
    if (!u) {
      valid = false;
      u = replacementCharacter;
    }
    writeWTF8CodePoint(os, *u);
  }

  return valid;
}